

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

string * __thiscall
soul::ResolutionPass::GenericFunctionResolver::getIDStringForFunction_abi_cxx11_
          (string *__return_storage_ptr__,GenericFunctionResolver *this,
          Function *resolvedGenericFunction)

{
  Type *pTVar1;
  pointer ppVar2;
  Function *extraout_RDX;
  pointer ppVar3;
  TypeArray types;
  undefined4 local_118;
  Primitive local_114;
  undefined8 local_110;
  Structure *local_108;
  undefined1 local_100 [216];
  
  local_100._0_8_ = local_100 + 0x18;
  local_100._8_8_ = 0;
  local_100._16_8_ = 8;
  ppVar3 = (resolvedGenericFunction->genericSpecialisations).
           super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (resolvedGenericFunction->genericSpecialisations).
           super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 != ppVar2) {
    do {
      (*(ppVar3->object->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject
        ._vptr_ASTObject[5])(&local_118);
      ArrayWithPreallocation<soul::Type,_8UL>::reserve
                ((ArrayWithPreallocation<soul::Type,_8UL> *)local_100,local_100._8_8_ + 1);
      pTVar1 = (Type *)(local_100._0_8_ + local_100._8_8_ * 0x18);
      pTVar1->category = (undefined1)local_118;
      pTVar1->arrayElementCategory = local_118._1_1_;
      pTVar1->isRef = (bool)local_118._2_1_;
      pTVar1->isConstant = (bool)local_118._3_1_;
      (((Type *)(local_100._0_8_ + local_100._8_8_ * 0x18))->primitiveType).type = local_114;
      ((Type *)(local_100._0_8_ + local_100._8_8_ * 0x18))->boundingSize = (undefined4)local_110;
      ((Type *)(local_100._0_8_ + local_100._8_8_ * 0x18))->arrayElementBoundingSize =
           local_110._4_4_;
      (((Type *)(local_100._0_8_ + local_100._8_8_ * 0x18))->structure).object = local_108;
      local_108 = (Structure *)0x0;
      local_100._8_8_ = local_100._8_8_ + 1;
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)0x0);
      ppVar3 = ppVar3 + 1;
      resolvedGenericFunction = extraout_RDX;
    } while (ppVar3 != ppVar2);
  }
  ASTUtilities::getTypeArraySignature_abi_cxx11_
            (__return_storage_ptr__,(ASTUtilities *)local_100,(TypeArray *)resolvedGenericFunction);
  ArrayWithPreallocation<soul::Type,_8UL>::clear
            ((ArrayWithPreallocation<soul::Type,_8UL> *)local_100);
  return __return_storage_ptr__;
}

Assistant:

std::string getIDStringForFunction (const AST::Function& resolvedGenericFunction)
        {
            AST::TypeArray types;

            for (auto t : resolvedGenericFunction.genericSpecialisations)
                types.push_back (t->resolveAsType());

            return ASTUtilities::getTypeArraySignature (types);
        }